

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugCompareHighsInfoObjective(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  double unaff_retaddr;
  double in_stack_00000008;
  HighsOptions *in_stack_00000010;
  string *in_stack_00000018;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"objective_function_value",&local_39);
  HVar1 = debugCompareHighsInfoDouble
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoObjective(const HighsOptions& options,
                                                const HighsInfo& highs_info0,
                                                const HighsInfo& highs_info1) {
  return debugCompareHighsInfoDouble("objective_function_value", options,
                                     highs_info0.objective_function_value,
                                     highs_info1.objective_function_value);
}